

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QSet<QTabBar_*> __thiscall QDockAreaLayout::usedTabBars(QDockAreaLayout *this)

{
  long lVar1;
  long in_FS_OFFSET;
  Data *local_28;
  
  local_28 = *(Data **)(in_FS_OFFSET + 0x28);
  this->corners[0] = NoDockWidgetArea;
  this->corners[1] = NoDockWidgetArea;
  lVar1 = 0x40;
  do {
    QDockAreaLayoutInfo::usedTabBars((QDockAreaLayoutInfo *)&stack0xffffffffffffffd0);
    QSet<QTabBar_*>::unite((QSet<QTabBar_*> *)this,(QSet<QTabBar_*> *)&stack0xffffffffffffffd0);
    QHash<QTabBar_*,_QHashDummyValue>::~QHash
              ((QHash<QTabBar_*,_QHashDummyValue> *)&stack0xffffffffffffffd0);
    lVar1 = lVar1 + 0x70;
  } while (lVar1 != 0x200);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_28) {
    return (QSet<QTabBar_*>)(Hash)this;
  }
  __stack_chk_fail();
}

Assistant:

QSet<QTabBar*> QDockAreaLayout::usedTabBars() const
{
    QSet<QTabBar*> result;
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        result += dock.usedTabBars();
    }
    return result;
}